

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O0

void SL::WS_LITE::
     ProcessControlMessage<true,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>>
               (shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                *socket,shared_ptr<unsigned_char> *buffer,size_t size,
               shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *extradata)

{
  shared_ptr<unsigned_char> *psVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  allocator<char> local_a1;
  string local_a0;
  shared_ptr<SL::WS_LITE::IWebSocket> local_80;
  shared_ptr<SL::WS_LITE::IWebSocket> local_70;
  uchar local_5d;
  OpCode opcode;
  allocator<char> local_49;
  string local_48;
  shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *local_28;
  shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *extradata_local;
  size_t size_local;
  shared_ptr<unsigned_char> *buffer_local;
  shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>_> *socket_local
  ;
  
  local_28 = extradata;
  extradata_local = (shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *)size;
  size_local = (size_t)buffer;
  buffer_local = (shared_ptr<unsigned_char> *)socket;
  peVar3 = std::
           __shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)socket);
  bVar2 = getFin(peVar3->ReceiveHeader);
  psVar1 = buffer_local;
  if (bVar2) {
    peVar3 = std::
             __shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)buffer_local);
    local_5d = getOpCode(peVar3->ReceiveHeader);
    psVar1 = buffer_local;
    if (local_5d == '\b') {
      ProcessClose<true,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>>
                ((shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                  *)buffer_local,(shared_ptr<unsigned_char> *)size_local,(size_t)extradata_local);
    }
    else {
      if (local_5d == '\t') {
        peVar3 = std::
                 __shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)buffer_local);
        peVar4 = std::
                 __shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar3->Parent);
        bVar2 = std::function::operator_cast_to_bool((function *)&peVar4->onPing);
        if (bVar2) {
          peVar3 = std::
                   __shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)buffer_local);
          peVar4 = std::
                   __shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar3->Parent);
          std::shared_ptr<SL::WS_LITE::IWebSocket>::
          shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>,void>
                    (&local_70,
                     (shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                      *)buffer_local);
          peVar5 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                             ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)size_local)
          ;
          std::
          function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_unsigned_char_*,_unsigned_long)>
          ::operator()(&peVar4->onPing,&local_70,peVar5,(unsigned_long)extradata_local);
          std::shared_ptr<SL::WS_LITE::IWebSocket>::~shared_ptr(&local_70);
        }
        SendPong<true,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>>
                  ((shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                    *)buffer_local,(shared_ptr<unsigned_char> *)size_local,(size_t)extradata_local);
      }
      else {
        if (local_5d != '\n') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"Closing connection. nonvalid op code",&local_a1);
          sendclosemessage<true,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>>
                    ((shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                      *)psVar1,0x3ea,&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::allocator<char>::~allocator(&local_a1);
          return;
        }
        peVar3 = std::
                 __shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)buffer_local);
        peVar4 = std::
                 __shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar3->Parent);
        bVar2 = std::function::operator_cast_to_bool((function *)&peVar4->onPong);
        if (bVar2) {
          peVar3 = std::
                   __shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)buffer_local);
          peVar4 = std::
                   __shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar3->Parent);
          std::shared_ptr<SL::WS_LITE::IWebSocket>::
          shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>,void>
                    (&local_80,
                     (shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                      *)buffer_local);
          peVar5 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                             ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)size_local)
          ;
          std::
          function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_unsigned_char_*,_unsigned_long)>
          ::operator()(&peVar4->onPong,&local_80,peVar5,(unsigned_long)extradata_local);
          std::shared_ptr<SL::WS_LITE::IWebSocket>::~shared_ptr(&local_80);
        }
      }
      ReadHeaderNext<true,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>>
                ((shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                  *)buffer_local,local_28);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Closing connection. Control Frames must be Fin",&local_49);
    sendclosemessage<true,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>>
              ((shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                *)psVar1,0x3ea,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  return;
}

Assistant:

inline void ProcessControlMessage(const SOCKETTYPE &socket, const std::shared_ptr<unsigned char> &buffer, size_t size,
                                      const std::shared_ptr<asio::streambuf> &extradata)
    {
        if (!getFin(socket->ReceiveHeader)) {
            return sendclosemessage<isServer>(socket, 1002, "Closing connection. Control Frames must be Fin");
        }
        auto opcode = static_cast<OpCode>(getOpCode(socket->ReceiveHeader));

        switch (opcode) {
        case OpCode::PING:
            if (socket->Parent->onPing) {
                socket->Parent->onPing(socket, buffer.get(), size);
            }
            SendPong<isServer>(socket, buffer, size);
            break;
        case OpCode::PONG:
            if (socket->Parent->onPong) {
                socket->Parent->onPong(socket, buffer.get(), size);
            }
            break;
        case OpCode::CLOSE:
            return ProcessClose<isServer>(socket, buffer, size);

        default:
            return sendclosemessage<isServer>(socket, 1002, "Closing connection. nonvalid op code");
        }
        ReadHeaderNext<isServer>(socket, extradata);
    }